

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment.cpp
# Opt level: O2

extent<pstore::repo::fragment>
(anonymous_namespace)::build_fragment<pstore::repo::section_content*>
          (transaction *transaction,section_content *begin,section_content *end)

{
  section_kind sVar1;
  generic_section_creation_dispatcher *pgVar2;
  uint64_t extraout_RDX;
  extent<pstore::repo::fragment> eVar3;
  not_null<const_pstore::repo::section_content_*> local_60;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  fdata;
  generic_section_creation_dispatcher *local_38;
  
  if (-0xe0 < (long)end - (long)begin) {
    fdata.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    fdata.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    fdata.
    super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; begin != end; begin = begin + 1) {
      pgVar2 = (generic_section_creation_dispatcher *)operator_new(0x18);
      sVar1 = begin->kind;
      local_60.ptr_ = begin;
      pstore::gsl::not_null<const_pstore::repo::section_content_*>::ensure_invariant(&local_60);
      (pgVar2->super_section_creation_dispatcher).kind_ = sVar1;
      (pgVar2->super_section_creation_dispatcher)._vptr_section_creation_dispatcher =
           (_func_int **)&PTR__section_creation_dispatcher_00192ed8;
      pgVar2->section_ = local_60.ptr_;
      local_38 = pgVar2;
      std::
      vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
      ::emplace_back<pstore::repo::generic_section_creation_dispatcher*>
                ((vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>
                  *)&fdata,&local_38);
    }
    eVar3 = pstore::repo::fragment::
            alloc<transaction,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                      (transaction,
                       (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                        )fdata.
                         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                        )fdata.
                         super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
    ::~vector(&fdata);
    eVar3.size = extraout_RDX;
    return eVar3;
  }
  pstore::assert_failed
            ("std::distance (begin, end) >= 0",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/mcrepo/test_fragment.cpp"
             ,0x31);
}

Assistant:

pstore::extent<fragment> build_fragment (transaction & transaction, Iterator begin,
                                             Iterator end) {
        std::vector<std::unique_ptr<section_creation_dispatcher>> fdata =
            build_sections (begin, end);
        return fragment::alloc (transaction, pstore::make_pointee_adaptor (fdata.begin ()),
                                pstore::make_pointee_adaptor (fdata.end ()));
    }